

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void process(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  double noise_level;
  Error EVar5;
  undefined1 local_c98 [8];
  DataManager data;
  ofstream output;
  undefined1 local_1f8 [8];
  ParameterSet param_denoiser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string model_name;
  string local_50;
  
  std::__cxx11::string::string((string *)local_98,argv[2],(allocator *)local_c98);
  std::__cxx11::string::substr((ulong)local_c98,(ulong)local_98);
  std::__cxx11::string::operator=((string *)local_98,(string *)local_c98);
  std::__cxx11::string::~string((string *)local_c98);
  std::__cxx11::string::string((string *)local_1f8,".out",(allocator *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  std::ofstream::ofstream
            (&data.mesh_.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .refcount_fcolors_,(string *)local_c98,_S_app);
  std::__cxx11::string::~string((string *)local_c98);
  std::__cxx11::string::~string((string *)local_1f8);
  DataManager::DataManager((DataManager *)local_c98);
  ParameterSet::ParameterSet((ParameterSet *)local_1f8);
  std::__cxx11::string::string
            ((string *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count,
             argv[2],(allocator *)&local_50);
  DataManager::ImportMeshFromFile
            ((DataManager *)local_c98,
             (string *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&local_50,argv[3],(allocator *)(model_name.field_2._M_local_buf + 8));
  noise_level = std::__cxx11::stod(&local_50,(size_t *)0x0);
  addNoise((DataManager *)local_c98,noise_level);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&model_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "(noisy ");
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&model_name.field_2 + 8),argv[3]);
  std::operator+(&local_b8,&local_50,").obj");
  DataManager::ExportMeshToFile((DataManager *)local_c98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)(model_name.field_2._M_local_buf + 8));
  std::chrono::_V2::system_clock::now();
  denoise((DataManager *)local_c98,argc,argv);
  std::chrono::_V2::system_clock::now();
  EVar5 = estimateMSAE((DataManager *)local_c98);
  std::__cxx11::string::string
            ((string *)&local_50,argv[1],(allocator *)(model_name.field_2._M_local_buf + 8));
  iVar1 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_50);
  if (iVar1 == 1) {
    pcVar3 = "Bilateral: ";
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_50,argv[1],(allocator *)(model_name.field_2._M_local_buf + 8));
    iVar1 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar1 != 2) goto LAB_001b0e0a;
    pcVar3 = " Fast&Effective: ";
  }
  std::operator<<((ostream *)
                  &data.mesh_.super_Mesh.
                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                   .
                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   .refcount_fcolors_,pcVar3);
LAB_001b0e0a:
  for (lVar4 = 3; lVar4 < argc; lVar4 = lVar4 + 1) {
    poVar2 = std::operator<<((ostream *)
                             &data.mesh_.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              .refcount_fcolors_,argv[lVar4]);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)
                  &data.mesh_.super_Mesh.
                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                   .
                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   .refcount_fcolors_,"noisy:");
  poVar2 = std::ostream::_M_insert<double>(EVar5.first);
  poVar2 = std::operator<<(poVar2," denoised:");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::close();
  ParameterSet::~ParameterSet((ParameterSet *)local_1f8);
  DataManager::~DataManager((DataManager *)local_c98);
  std::ofstream::~ofstream
            (&data.mesh_.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .refcount_fcolors_);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void process(int argc, char *argv[])
{
    auto model_name = string(argv[2]);
    model_name = model_name.substr(0, model_name.length() - 4);
    std::ofstream output(model_name + string(".out"), std::ios::app);
    DataManager data;
    ParameterSet param_denoiser;
    // Add noise to model and export it
    data.ImportMeshFromFile(argv[2]);
    addNoise(&data, std::stod(argv[3]));
    data.ExportMeshToFile(model_name + "(noisy " + argv[3]  + ").obj");
    // Denoise the model then measure the error and the duration
    auto beg = std::chrono::high_resolution_clock::now();
    denoise(&data, argc, argv);
    auto end = std::chrono::high_resolution_clock::now();

    auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(end - beg).count();
    auto er = estimateMSAE(data);
    // export the denoised model.
    if(std::stoi(argv[1]) == 1)
        output << "Bilateral: ";
    else if(std::stoi(argv[1]) == 2)
        output << " Fast&Effective: ";

    for(int i = 3; i < argc; ++i)
        output << argv[i] << " ";
    output << "noisy:" << er.first << " denoised:" << std::endl;
    output.close();
}